

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O0

int __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::RandomHeight
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this)

{
  uint32_t uVar1;
  long in_RDI;
  bool bVar2;
  int height;
  undefined4 local_c;
  
  local_c = 1;
  while( true ) {
    bVar2 = false;
    if (local_c < 0xc) {
      uVar1 = Random::Next((Random *)(in_RDI + 0x24));
      bVar2 = (uVar1 & 3) == 0;
    }
    if (!bVar2) break;
    local_c = local_c + 1;
  }
  return local_c;
}

Assistant:

int SkipList<Key, Comparator>::RandomHeight() {
  // Increase height with probability 1 in kBranching
  static const unsigned int kBranching = 4;
  int height = 1;
  while (height < kMaxHeight && ((rnd_.Next() % kBranching) == 0)) {
    height++;
  }
  assert(height > 0);
  assert(height <= kMaxHeight);
  return height;
}